

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O3

void __thiscall DListMenu::Ticker(DListMenu *this)

{
  FListMenuDescriptor *pFVar1;
  ulong uVar2;
  
  DMenu::Ticker(&this->super_DMenu);
  pFVar1 = this->mDesc;
  if ((pFVar1->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count != 0) {
    uVar2 = 0;
    do {
      (*(pFVar1->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar2]->
        _vptr_FListMenuItem[3])();
      uVar2 = uVar2 + 1;
      pFVar1 = this->mDesc;
    } while (uVar2 < (pFVar1->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count);
  }
  return;
}

Assistant:

void DListMenu::Ticker ()
{
	Super::Ticker();
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		mDesc->mItems[i]->Ticker();
	}
}